

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

void json_value_free_ex(json_settings *settings,json_value *value)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *in_RSI;
  long in_RDI;
  json_value *cur_value;
  undefined8 *local_10;
  
  if (in_RSI != (undefined8 *)0x0) {
    *in_RSI = 0;
    local_10 = in_RSI;
    while (local_10 != (undefined8 *)0x0) {
      iVar1 = *(int *)(local_10 + 1);
      if (iVar1 == 1) {
        if (*(int *)(local_10 + 2) == 0) {
          (**(code **)(in_RDI + 0x18))(local_10[3],*(undefined8 *)(in_RDI + 0x20));
LAB_00133a14:
          puVar2 = (undefined8 *)*local_10;
          (**(code **)(in_RDI + 0x18))(local_10,*(undefined8 *)(in_RDI + 0x20));
          local_10 = puVar2;
        }
        else {
          iVar1 = *(int *)(local_10 + 2);
          *(uint *)(local_10 + 2) = iVar1 - 1U;
          local_10 = *(undefined8 **)(local_10[3] + (ulong)(iVar1 - 1U) * 0x18 + 0x10);
        }
      }
      else {
        if (iVar1 != 2) {
          if (iVar1 == 5) {
            (**(code **)(in_RDI + 0x18))(local_10[3],*(undefined8 *)(in_RDI + 0x20));
          }
          goto LAB_00133a14;
        }
        if (*(int *)(local_10 + 2) == 0) {
          (**(code **)(in_RDI + 0x18))(local_10[3],*(undefined8 *)(in_RDI + 0x20));
          goto LAB_00133a14;
        }
        iVar1 = *(int *)(local_10 + 2);
        *(uint *)(local_10 + 2) = iVar1 - 1U;
        local_10 = *(undefined8 **)(local_10[3] + (ulong)(iVar1 - 1U) * 8);
      }
    }
  }
  return;
}

Assistant:

void json_value_free_ex (json_settings * settings, json_value * value)
{
   json_value * cur_value;

   if (!value)
      return;

   value->parent = 0;

   while (value)
   {
      switch (value->type)
      {
         case json_array:

            if (!value->u.array.length)
            {
               settings->mem_free (value->u.array.values, settings->user_data);
               break;
            }

            value = value->u.array.values [-- value->u.array.length];
            continue;

         case json_object:

            if (!value->u.object.length)
            {
               settings->mem_free (value->u.object.values, settings->user_data);
               break;
            }

            value = value->u.object.values [-- value->u.object.length].value;
            continue;

         case json_string:

            settings->mem_free (value->u.string.ptr, settings->user_data);
            break;

         default:
            break;
      };

      cur_value = value;
      value = value->parent;
      settings->mem_free (cur_value, settings->user_data);
   }
}